

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_process_option(nn_parse_context *ctx,int opt_index,char *argument)

{
  FILE *pFVar1;
  nn_option *pnVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  size_t sVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  size_t *psVar10;
  float fVar11;
  size_t sStack_60;
  int bytes_read;
  size_t data_buf;
  size_t data_len;
  char *data;
  FILE *file;
  nn_blob *blob;
  char *endptr;
  nn_enum_item *items;
  nn_option *opt;
  char *argument_local;
  nn_parse_context *pnStack_10;
  int opt_index_local;
  nn_parse_context *ctx_local;
  
  items = (nn_enum_item *)(ctx->options + opt_index);
  opt = (nn_option *)argument;
  argument_local._4_4_ = opt_index;
  pnStack_10 = ctx;
  if ((ctx->mask & ((nn_option *)items)->conflicts_mask) != 0) {
    nn_option_conflict(ctx,opt_index);
  }
  pnStack_10->mask = pnStack_10->mask | *(ulong *)&items[2].value;
  switch(items[1].value) {
  case 0:
    nn_print_help(pnStack_10,_stdout);
    exit(0);
  case 1:
    lVar4 = strtol((char *)opt,(char **)&blob,0);
    *(long *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) = lVar4;
    if (((nn_option *)blob == opt) || (*(char *)&blob->data != '\0')) {
      nn_option_error("requires integer argument",pnStack_10,argument_local._4_4_);
    }
    break;
  case 2:
    *(int *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) =
         *(int *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) + 1;
    break;
  case 3:
    *(int *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) =
         *(int *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) + -1;
    break;
  case 4:
    for (endptr = items[2].name; *(long *)endptr != 0; endptr = endptr + 0x10) {
      iVar3 = strcmp(*(char **)endptr,(char *)opt);
      if (iVar3 == 0) {
        *(undefined4 *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) =
             *(undefined4 *)(endptr + 8);
        return;
      }
    }
    nn_invalid_enum_value(pnStack_10,argument_local._4_4_,(char *)opt);
    break;
  case 5:
    *(undefined4 *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) =
         *(undefined4 *)items[2].name;
    break;
  case 6:
    *(nn_option **)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) = opt;
    break;
  case 7:
    puVar5 = (undefined8 *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc);
    *puVar5 = opt;
    sVar7 = strlen((char *)opt);
    *(int *)(puVar5 + 1) = (int)sVar7;
    *(undefined4 *)((long)puVar5 + 0xc) = 0;
    break;
  case 8:
    fVar11 = strtof((char *)opt,(char **)&blob);
    *(float *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc) = fVar11;
    if (((nn_option *)blob == opt) || (*(char *)&blob->data != '\0')) {
      nn_option_error("requires float point argument",pnStack_10,argument_local._4_4_);
    }
    break;
  case 9:
    nn_append_string(pnStack_10,(nn_option *)items,(char *)opt);
    break;
  case 10:
    sVar6 = strlen((char *)opt);
    sVar7 = strlen(items[2].name);
    sVar6 = sVar6 + sVar7;
    pcVar9 = (char *)malloc(sVar6);
    iVar3 = snprintf(pcVar9,sVar6,items[2].name,opt);
    if (sVar6 <= (ulong)(long)iVar3) {
      __assert_fail("data_len < data_buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                    ,0x1cc,"void nn_process_option(struct nn_parse_context *, int, char *)");
    }
    nn_append_string(pnStack_10,(nn_option *)items,pcVar9);
    nn_append_string_to_free(pnStack_10,(nn_option *)items,pcVar9);
    break;
  case 0xb:
    iVar3 = strcmp((char *)opt,"-");
    if (iVar3 == 0) {
      data = _stdin;
    }
    else {
      data = (char *)fopen((char *)opt,"r");
      pnVar2 = opt;
      pFVar1 = _stderr;
      if ((FILE *)data == (FILE *)0x0) {
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        fprintf(pFVar1,"Error opening file ``%s\'\': %s\n",pnVar2,pcVar9);
        exit(2);
      }
    }
    data_len = (size_t)malloc(0x1000);
    if ((void *)data_len == (void *)0x0) {
      nn_memory_error(pnStack_10);
    }
    data_buf = 0;
    sStack_60 = 0x1000;
    while( true ) {
      sVar7 = fread((void *)(data_len + data_buf),1,sStack_60 - data_buf,(FILE *)data);
      data_buf = (long)(int)sVar7 + data_buf;
      iVar3 = feof((FILE *)data);
      if (iVar3 != 0) break;
      if (sStack_60 - data_buf < 0x400) {
        if (sStack_60 < 0x100000) {
          sStack_60 = sStack_60 << 1;
        }
        else {
          sStack_60 = sStack_60 + 0x100000;
        }
        data_len = (size_t)realloc((void *)data_len,sStack_60);
        if ((void *)data_len == (void *)0x0) {
          nn_memory_error(pnStack_10);
        }
      }
    }
    if ((data_buf != sStack_60) &&
       (data_len = (size_t)realloc((void *)data_len,data_buf), (void *)data_len == (void *)0x0)) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                    ,499,"void nn_process_option(struct nn_parse_context *, int, char *)");
    }
    iVar3 = ferror((FILE *)data);
    pnVar2 = opt;
    pFVar1 = _stderr;
    if (iVar3 != 0) {
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      fprintf(pFVar1,"Error reading file ``%s\'\': %s\n",pnVar2,pcVar9);
      exit(2);
    }
    if (data != _stdin) {
      fclose((FILE *)data);
    }
    psVar10 = (size_t *)((long)pnStack_10->target + (long)*(int *)&items[1].field_0xc);
    *psVar10 = data_len;
    *(int *)(psVar10 + 1) = (int)data_buf;
    *(undefined4 *)((long)psVar10 + 0xc) = 1;
    break;
  default:
    abort();
  }
  return;
}

Assistant:

static void nn_process_option (struct nn_parse_context *ctx,
                              int opt_index, char *argument)
{
    struct nn_option *opt;
    struct nn_enum_item *items;
    char *endptr;
    struct nn_blob *blob;
    FILE *file;
    char *data;
    size_t data_len;
    size_t data_buf;
    int bytes_read;

    opt = &ctx->options[opt_index];
    if (ctx->mask & opt->conflicts_mask) {
        nn_option_conflict (ctx, opt_index);
    }
    ctx->mask |= opt->mask_set;

    switch (opt->type) {
        case NN_OPT_HELP:
            nn_print_help (ctx, stdout);
            exit (0);
            return;
        case NN_OPT_INT:
            *(long *)(((char *)ctx->target) + opt->offset) = strtol (argument,
                &endptr, 0);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires integer argument",
                                ctx, opt_index);
            }
            return;
        case NN_OPT_INCREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) += 1;
            return;
        case NN_OPT_DECREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) -= 1;
            return;
        case NN_OPT_ENUM:
            items = (struct nn_enum_item *)opt->pointer;
            for (;items->name; ++items) {
                if (!strcmp (items->name, argument)) {
                    *(int *)(((char *)ctx->target) + opt->offset) = \
                        items->value;
                    return;
                }
            }
            nn_invalid_enum_value (ctx, opt_index, argument);
            return;
        case NN_OPT_SET_ENUM:
            *(int *)(((char *)ctx->target) + opt->offset) = \
                *(int *)(opt->pointer);
            return;
        case NN_OPT_STRING:
            *(char **)(((char *)ctx->target) + opt->offset) = argument;
            return;
        case NN_OPT_BLOB:
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = argument;
            blob->length = strlen (argument);
            blob->need_free = 0;
            return;
        case NN_OPT_FLOAT:
#if defined NN_HAVE_WINDOWS
            *(float *)(((char *)ctx->target) + opt->offset) =
                (float) atof (argument);
#else
            *(float *)(((char *)ctx->target) + opt->offset) =
                strtof (argument, &endptr);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires float point argument",
                                ctx, opt_index);
            }
#endif
            return;
        case NN_OPT_LIST_APPEND:
            nn_append_string (ctx, opt, argument);
            return;
        case NN_OPT_LIST_APPEND_FMT:
            data_buf = strlen (argument) + strlen (opt->pointer);
            data = malloc (data_buf);
#if defined NN_HAVE_WINDOWS
            data_len = _snprintf_s (data, data_buf, _TRUNCATE, opt->pointer,
                argument);
#else
            data_len = snprintf (data, data_buf, opt->pointer, argument);
#endif
            assert (data_len < data_buf);
            nn_append_string (ctx, opt, data);
            nn_append_string_to_free (ctx, opt, data);
            return;
        case NN_OPT_READ_FILE:
            if (!strcmp (argument, "-")) {
                file = stdin;
            } else {
                file = fopen (argument, "r");
                if (!file) {
                    fprintf (stderr, "Error opening file ``%s'': %s\n",
                        argument, strerror (errno));
                    exit (2);
                }
            }
            data = malloc (4096);
            if (!data)
                nn_memory_error (ctx);
            data_len = 0;
            data_buf = 4096;
            for (;;) {
                bytes_read = fread (data + data_len, 1, data_buf - data_len,
                                   file);
                data_len += bytes_read;
                if (feof (file))
                    break;
                if (data_buf - data_len < 1024) {
                    if (data_buf < (1 << 20)) {
                        data_buf *= 2;  /* grow twice until not too big */
                    } else {
                        data_buf += 1 << 20;  /* grow 1 Mb each time */
                    }
                    data = realloc (data, data_buf);
                    if (!data)
                        nn_memory_error (ctx);
                }
            }
            if (data_len != data_buf) {
                data = realloc (data, data_len);
                assert (data);
            }
            if (ferror (file)) {
#if defined _MSC_VER
#pragma warning (push)
#pragma warning (disable:4996)
#endif
                fprintf (stderr, "Error reading file ``%s'': %s\n",
                    argument, strerror (errno));
#if defined _MSC_VER
#pragma warning (pop)
#endif
                exit (2);
            }
            if (file != stdin) {
                fclose (file);
            }
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = data;
            blob->length = data_len;
            blob->need_free = 1;
            return;
    }
    abort ();
}